

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

ActionMessage * __thiscall
helics::NetworkCommsInterface::generateReplyToIncomingMessage
          (NetworkCommsInterface *this,ActionMessage *cmd)

{
  bool bVar1;
  int data;
  __int_type_conflict val;
  long in_RDX;
  allocator<char> *in_RSI;
  ActionMessage *in_RDI;
  __sv_type _Var2;
  int openPort;
  int cnt;
  ActionMessage *resp;
  int32_t in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  __atomic_base<int> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff34;
  uint local_c8;
  action_t in_stack_ffffffffffffff3c;
  ActionMessage *this_00;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  GlobalFederateId in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff64;
  byte bVar3;
  byte bVar4;
  allocator<char> in_stack_ffffffffffffff67;
  undefined1 in_stack_ffffffffffffff98 [16];
  undefined1 auVar5 [12];
  string_view in_stack_ffffffffffffffa8;
  string_view local_48;
  int local_34;
  uint local_30;
  undefined1 local_19;
  long local_18;
  
  auVar5 = in_stack_ffffffffffffff98._4_12_;
  this_00 = in_RDI;
  local_18 = in_RDX;
  bVar1 = isProtocolCommand((ActionMessage *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar1) {
    in_stack_ffffffffffffff3c = *(action_t *)(local_18 + 4);
    if (in_stack_ffffffffffffff3c == 0x12d) {
      ActionMessage::ActionMessage(this_00,0x12d);
      this_00->messageID = 0x130;
      return in_RDI;
    }
    if (in_stack_ffffffffffffff3c == 0x5ad) {
      local_19 = 0;
      ActionMessage::ActionMessage(this_00,0x5ad);
      this_00->messageID = 0x5ab;
      std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff28);
      ActionMessage::setExtraData
                ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
      return in_RDI;
    }
    if (in_stack_ffffffffffffff3c == 0x5af) {
      if (*(short *)(local_18 + 0x18) == 0) {
        local_c8 = 2;
      }
      else {
        local_c8 = (uint)*(ushort *)(local_18 + 0x18);
      }
      local_30 = local_c8;
      local_48 = ActionMessage::name((ActionMessage *)0x3fb718);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_48);
      bVar4 = 0;
      bVar3 = 0;
      if (bVar1) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,local_30),(char *)in_stack_ffffffffffffff28);
        data = findOpenPort(auVar5._4_8_,auVar5._0_4_,in_stack_ffffffffffffffa8);
      }
      else {
        in_stack_ffffffffffffff24 = local_30;
        ActionMessage::name((ActionMessage *)0x3fb7a3);
        in_stack_ffffffffffffff28 = (__atomic_base<int> *)&stack0xffffffffffffff67;
        std::allocator<char>::allocator();
        bVar4 = 1;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(1,CONCAT15(bVar3,CONCAT14(in_stack_ffffffffffffff64,
                                                               in_stack_ffffffffffffff60.gid)))),
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff5f,
                            CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)),in_RSI);
        bVar3 = 1;
        _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        in_stack_ffffffffffffff20 =
             findOpenPort((NetworkCommsInterface *)_Var2._M_str,_Var2._M_len._4_4_,
                          in_stack_ffffffffffffffa8);
        data = in_stack_ffffffffffffff20;
      }
      if ((bVar3 & 1) != 0) {
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
      if ((bVar4 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
      }
      local_34 = data;
      ActionMessage::ActionMessage(this_00,in_stack_ffffffffffffff3c);
      this_00->messageID = 0x5ab;
      val = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff28);
      GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff60,val);
      (this_00->source_id).gid = in_stack_ffffffffffffff60.gid;
      ActionMessage::setExtraData
                ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),data
                );
      this_00->counter = *(uint16_t *)(local_18 + 0x18);
      return in_RDI;
    }
  }
  ActionMessage::ActionMessage(this_00,in_stack_ffffffffffffff3c);
  return in_RDI;
}

Assistant:

ActionMessage NetworkCommsInterface::generateReplyToIncomingMessage(ActionMessage& cmd)
{
    if (isProtocolCommand(cmd)) {
        switch (cmd.messageID) {
            case QUERY_PORTS: {
                ActionMessage portReply(CMD_PROTOCOL);
                portReply.messageID = PORT_DEFINITIONS;
                portReply.setExtraData(PortNumber);
                return portReply;
            } break;
            case REQUEST_PORTS: {
                int cnt = (cmd.counter == 0) ? 2 : cmd.counter;
                auto openPort = (cmd.name().empty()) ? findOpenPort(cnt, localHostString) :
                                                       findOpenPort(cnt, std::string(cmd.name()));
                ActionMessage portReply(CMD_PROTOCOL);
                portReply.messageID = PORT_DEFINITIONS;
                portReply.source_id = GlobalFederateId(PortNumber);
                portReply.setExtraData(openPort);
                portReply.counter = cmd.counter;
                return portReply;
            } break;
            case CONNECTION_REQUEST: {
                ActionMessage connAck(CMD_PROTOCOL);
                connAck.messageID = CONNECTION_ACK;
                return connAck;
            } break;
            default:
                break;
        }
    }
    ActionMessage resp(CMD_IGNORE);
    return resp;
}